

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

void LTFlightData::AppendAllNewPos(void)

{
  atomic_flag aVar1;
  int iVar2;
  _Base_ptr p_Var3;
  unique_lock<std::mutex> lock;
  unique_lock<std::recursive_mutex> lockFD;
  unique_lock<std::mutex> local_50;
  unique_lock<std::recursive_mutex> local_40;
  
  aVar1.super___atomic_flag_base._M_i = flagNoNewPosToAdd.super___atomic_flag_base._M_i;
  LOCK();
  flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)true;
  UNLOCK();
  if (aVar1.super___atomic_flag_base._M_i == false) {
    local_50._M_device = &mapFdMutex;
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)&mapFdMutex);
    local_50._M_owns = iVar2 == 0;
    if (local_50._M_owns) {
      if ((_Rb_tree_header *)mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &mapFd._M_t._M_impl.super__Rb_tree_header) {
        p_Var3 = mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_40._M_device = (mutex_type *)&p_Var3[0x1e]._M_parent;
          iVar2 = pthread_mutex_trylock((pthread_mutex_t *)local_40._M_device);
          local_40._M_owns = iVar2 == 0;
          if (local_40._M_owns) {
            if ((char)p_Var3[0x1e]._M_color == _S_black) {
              AppendNewPos((LTFlightData *)&p_Var3[2]._M_left);
            }
          }
          else {
            LOCK();
            flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
            UNLOCK();
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        } while ((_Rb_tree_header *)p_Var3 != &mapFd._M_t._M_impl.super__Rb_tree_header);
      }
    }
    else {
      LOCK();
      flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
      UNLOCK();
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_50);
  }
  return;
}

Assistant:

void LTFlightData::AppendAllNewPos()
{
    // short-cut if nothing to do
    if (flagNoNewPosToAdd.test_and_set())
        return;

    // somewhere there is something to do
    // need access to flight data map
    try {
        std::unique_lock<std::mutex> lock (mapFdMutex, std::try_to_lock);
        if (!lock) {
            // couldn't get the lock right away
            // -> return, we don't want to hinder rendering
            flagNoNewPosToAdd.clear();      // but need to try again
            return;
        }
        
        // loop all flight data objects and check for new data to analyse
        for (mapLTFlightDataTy::value_type& fdPair: mapFd) {
            LTFlightData& fd = fdPair.second;
            try {
                std::unique_lock<std::recursive_mutex> lockFD (fd.dataAccessMutex, std::try_to_lock);
                if (!lockFD) {
                    flagNoNewPosToAdd.clear();          // need to try it again
                } else {
                    if (fd.IsValid())
                        fd.AppendNewPos();
                }
            } catch (const std::exception& e) {
                LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
                fd.SetInvalid();
            } catch (...) {
                fd.SetInvalid();
            }
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFdMutex", e.what());
        flagNoNewPosToAdd.clear();
    }
}